

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void nonius::go<std::chrono::_V2::system_clock>
               (configuration *cfg,benchmark_registry *benchmarks,reporter_registry *reporters)

{
  bool bVar1;
  no_such_reporter *this;
  iterator it;
  reporter *in_stack_00000428;
  configuration *in_stack_00000430;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_00000438;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_00000440;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
  *in_stack_fffffffffffffe48;
  configuration *in_stack_fffffffffffffe50;
  configuration *in_stack_fffffffffffffe78;
  configuration *in_stack_fffffffffffffe80;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_fffffffffffffec8;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  in_stack_fffffffffffffed0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_28;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_true>
  local_20 [4];
  
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::find(in_stack_fffffffffffffe48,(key_type *)0x21658b);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>_>_>
       ::end(in_stack_fffffffffffffe48);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (!bVar1) {
    std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::begin
              ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
               in_stack_fffffffffffffe48);
    std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::end
              ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
               in_stack_fffffffffffffe48);
    validate_benchmarks<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    configuration::configuration(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::begin
              ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
               in_stack_fffffffffffffe48);
    std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::end
              ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
               in_stack_fffffffffffffe48);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>_>,_false,_true>
                  *)0x216682);
    std::unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_>::operator*
              ((unique_ptr<nonius::reporter,_std::default_delete<nonius::reporter>_> *)
               in_stack_fffffffffffffe50);
    go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
              (in_stack_00000430,in_stack_00000440,in_stack_00000438,in_stack_00000428);
    configuration::~configuration(in_stack_fffffffffffffe50);
    return;
  }
  this = (no_such_reporter *)__cxa_allocate_exception(8);
  memset(this,0,8);
  no_such_reporter::no_such_reporter(this);
  __cxa_throw(this,&no_such_reporter::typeinfo,no_such_reporter::~no_such_reporter);
}

Assistant:

void go(configuration cfg, benchmark_registry& benchmarks = global_benchmark_registry(), reporter_registry& reporters = global_reporter_registry()) {
        auto it = reporters.find(cfg.reporter);
        if(it == reporters.end()) throw no_such_reporter();
        validate_benchmarks<Clock>(benchmarks.begin(), benchmarks.end());
        go<Clock>(cfg, benchmarks.begin(), benchmarks.end(), *it->second);
    }